

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::OverheadTest_SingleMassiveBlockThenLittle_Test::
~OverheadTest_SingleMassiveBlockThenLittle_Test
          (OverheadTest_SingleMassiveBlockThenLittle_Test *this)

{
  OverheadTest_SingleMassiveBlockThenLittle_Test *this_local;
  
  ~OverheadTest_SingleMassiveBlockThenLittle_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OverheadTest, SingleMassiveBlockThenLittle) {
  OverheadTest test;
  // Little blocks
  for (int i = 0; i < 4; i++) {
    test.Alloc(32);
  }
  // Big block!
  test.Alloc(16000);
  for (int i = 0; i < 50; i++) {
    test.Alloc(64);
  }
  if (!UPB_ASAN) {
#ifdef __ANDROID__
    EXPECT_NEAR(test.WastePct(), 0.075, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.09, 0.025);
#else
    EXPECT_NEAR(test.WastePct(), 0.08, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 0.09, 0.025);
#endif
  }
}